

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<vector<PiecewiseConstant1D>_>::value_&&_HasData<vector<PiecewiseConstant1D>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
           *v)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  PiecewiseConstant1D *v_00;
  
  std::operator<<(os,"[ ");
  v_00 = v->ptr;
  for (uVar2 = 0; uVar2 < v->nStored; uVar2 = uVar2 + 1) {
    pbrt::operator<<(os,v_00);
    if (uVar2 < v->nStored - 1) {
      std::operator<<(os,", ");
    }
    v_00 = v_00 + 1;
  }
  poVar1 = std::operator<<(os," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}